

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O2

void __thiscall avro::StreamReader::more(StreamReader *this)

{
  Exception *this_00;
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = fill(this);
  if (bVar1) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"EOF reached",&local_39);
  Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void more() {
        if (! fill()) {
            throw Exception("EOF reached");
        }
    }